

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

int __thiscall QHeaderView::sectionSizeHint(QHeaderView *this,int logicalIndex)

{
  long lVar1;
  QSize QVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QSize QVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  bVar3 = isSectionHidden(this,logicalIndex);
  RVar7.m_i = 0;
  if (!bVar3) {
    RVar7.m_i = -1;
    if (-1 < logicalIndex) {
      iVar4 = count(this);
      if (logicalIndex < iVar4) {
        local_58._16_4_ = 0xaaaaaaaa;
        local_58._20_4_ = 0xaaaaaaaa;
        uStack_40 = 0xaaaaaaaa;
        uStack_3c = 0xaaaaaaaa;
        local_58._0_4_ = 0xaaaaaaaa;
        local_58._4_4_ = 0xaaaaaaaa;
        local_58._8_4_ = 0xaaaaaaaa;
        local_58._12_4_ = 0xaaaaaaaa;
        (**(code **)(**(long **)(lVar1 + 0x2f8) + 0xa0))
                  (&local_58,*(long **)(lVar1 + 0x2f8),logicalIndex,*(undefined4 *)(lVar1 + 0x548),
                   0xd);
        if (CONCAT44(uStack_3c,uStack_40) < 4) {
          QVar6 = (QSize)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                                super_QAbstractScrollArea.super_QFrame.super_QWidget
                                     + 0x308))(this,logicalIndex);
        }
        else {
          QVar6 = qvariant_cast<QSize>((QVariant *)&local_58);
        }
        QVar2 = (QSize)((ulong)QVar6 >> 0x20);
        if (*(int *)(lVar1 + 0x548) == 1) {
          QVar2 = QVar6;
        }
        iVar5 = minimumSectionSize(this);
        iVar4 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x608);
        RVar7.m_i = 0xfffff;
        if (iVar4 != -1) {
          RVar7.m_i = iVar4;
        }
        if (QVar2.wd.m_i.m_i <= RVar7.m_i) {
          RVar7.m_i = QVar2.wd.m_i.m_i;
        }
        if (RVar7.m_i < iVar5) {
          RVar7.m_i = iVar5;
        }
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return RVar7.m_i;
  }
  __stack_chk_fail();
}

Assistant:

int QHeaderView::sectionSizeHint(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (isSectionHidden(logicalIndex))
        return 0;
    if (logicalIndex < 0 || logicalIndex >= count())
        return -1;
    QSize size;
    QVariant value = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (value.isValid())
        size = qvariant_cast<QSize>(value);
    else
        size = sectionSizeFromContents(logicalIndex);
    int hint = d->orientation == Qt::Horizontal ? size.width() : size.height();
    return qBound(minimumSectionSize(), hint, maximumSectionSize());
}